

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O1

void __thiscall
ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader
          (TrackFileWriter<ASDCP::MXF::OP1aHeader> *this,MXFVersion *mxf_ver,
          vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *conformsToSpecifications)

{
  set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_> *this_00;
  UL *pUVar1;
  undefined8 uVar2;
  Preface *pPVar3;
  MDDEntry *pMVar4;
  Identification *this_01;
  char *__s;
  char *pcVar5;
  long lVar6;
  ui16_t uVar7;
  ui16_t uVar8;
  Partition *this_02;
  UL *__v;
  vector<int,_std::allocator<int>_> version;
  int local_6c;
  UTF16String local_68;
  MXFVersion *local_40;
  Partition *local_38;
  
  if (this->m_Dict == (Dictionary *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x285,
                  "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                 );
  }
  if (this->m_EssenceDescriptor == (FileDescriptor *)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x286,
                  "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                 );
  }
  Primer::ClearTagList(&(this->m_HeaderPart).m_Primer);
  pPVar3 = (Preface *)operator_new(0x260);
  Preface::Preface(pPVar3,this->m_Dict);
  this_02 = &(this->m_HeaderPart).super_Partition;
  (this->m_HeaderPart).m_Preface = pPVar3;
  Partition::AddChildObject(this_02,(InterchangeObject *)pPVar3);
  if (conformsToSpecifications != (vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *)0x0) {
    __v = *(UL **)conformsToSpecifications;
    pUVar1 = *(UL **)(conformsToSpecifications + 8);
    if (pUVar1 != __v) {
      pPVar3 = (this->m_HeaderPart).m_Preface;
      (pPVar3->ConformsToSpecifications).m_has_value = true;
      this_00 = &(pPVar3->ConformsToSpecifications).m_property.
                 super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
                 super_PushSet<ASDCP::UL>.
                 super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>;
      local_68.super_IArchive._vptr_IArchive = (_func_int **)this_00;
      local_40 = mxf_ver;
      local_38 = this_02;
      do {
        std::
        _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
        ::
        _M_insert_unique_<ASDCP::UL_const&,std::_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>::_Alloc_node>
                  ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                    *)this_00,
                   (_Base_ptr)
                   ((long)&(pPVar3->ConformsToSpecifications).m_property.
                           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
                           super_PushSet<ASDCP::UL>.
                           super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
                           _M_t._M_impl + 8),__v,(_Alloc_node *)&local_68);
        __v = __v + 1;
        mxf_ver = local_40;
        this_02 = local_38;
      } while (__v != pUVar1);
    }
  }
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_OP1a);
  local_68.super_IArchive._vptr_IArchive = *(_func_int ***)pMVar4->ul;
  local_68.super_string._M_dataplus._M_p = *(pointer *)(pMVar4->ul + 8);
  pPVar3 = (this->m_HeaderPart).m_Preface;
  (pPVar3->OperationalPattern).super_Identifier<16U>.m_HasValue = true;
  *(_func_int ***)(pPVar3->OperationalPattern).super_Identifier<16U>.m_Value =
       local_68.super_IArchive._vptr_IArchive;
  *(pointer *)((pPVar3->OperationalPattern).super_Identifier<16U>.m_Value + 8) =
       local_68.super_string._M_dataplus._M_p;
  pPVar3 = (this->m_HeaderPart).m_Preface;
  (this->m_HeaderPart).super_Partition.OperationalPattern.super_Identifier<16U>.m_HasValue =
       (pPVar3->OperationalPattern).super_Identifier<16U>.m_HasValue;
  uVar2 = *(undefined8 *)((pPVar3->OperationalPattern).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)
   (this->m_HeaderPart).super_Partition.OperationalPattern.super_Identifier<16U>.m_Value =
       *(undefined8 *)(pPVar3->OperationalPattern).super_Identifier<16U>.m_Value;
  *(undefined8 *)
   ((this->m_HeaderPart).super_Partition.OperationalPattern.super_Identifier<16U>.m_Value + 8) =
       uVar2;
  if (*mxf_ver == MXFVersion_2004) {
    uVar7 = 0x102;
    uVar8 = 2;
  }
  else {
    if (*mxf_ver != MXFVersion_2011) {
      __assert_fail("mxf_ver == MXFVersion_2011",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                    ,0x2a5,
                    "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                   );
    }
    uVar7 = 0x103;
    uVar8 = 3;
  }
  (this->m_HeaderPart).super_Partition.MinorVersion = uVar8;
  pPVar3->Version = uVar7;
  (pPVar3->ObjectModelVersion).m_property = 1;
  (pPVar3->ObjectModelVersion).m_has_value = true;
  this_01 = (Identification *)operator_new(0x1d0);
  Identification::Identification(this_01,this->m_Dict);
  Partition::AddChildObject(this_02,(InterchangeObject *)this_01);
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
            (&(((this->m_HeaderPart).m_Preface)->Identifications).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
              super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>,
             &(this_01->super_InterchangeObject).InstanceUID);
  Kumu::GenRandomValue(&this_01->ThisGenerationUID);
  UTF16String::operator=(&this_01->CompanyName,(this->m_Info).CompanyName._M_dataplus._M_p);
  UTF16String::operator=(&this_01->ProductName,(this->m_Info).ProductName._M_dataplus._M_p);
  UTF16String::operator=(&this_01->VersionString,(this->m_Info).ProductVersion._M_dataplus._M_p);
  (this_01->ProductUID).super_Identifier<16U>.m_HasValue = true;
  uVar2 = *(undefined8 *)((this->m_Info).ProductUUID + 8);
  *(undefined8 *)(this_01->ProductUID).super_Identifier<16U>.m_Value =
       *(undefined8 *)(this->m_Info).ProductUUID;
  *(undefined8 *)((this_01->ProductUID).super_Identifier<16U>.m_Value + 8) = uVar2;
  UTF16String::UTF16String(&local_68,"unix");
  std::__cxx11::string::_M_assign((string *)&(this_01->Platform).m_property.super_string);
  (this_01->Platform).m_has_value = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_string._M_dataplus._M_p != &local_68.super_string.field_2) {
    operator_delete(local_68.super_string._M_dataplus._M_p,
                    local_68.super_string.field_2._M_allocated_capacity + 1);
  }
  __s = Version();
  local_68.super_IArchive._vptr_IArchive = (_func_int **)0x0;
  local_68.super_string._M_dataplus._M_p = (pointer)0x0;
  local_68.super_string._M_string_length = 0;
  pcVar5 = strchr(__s,0x2e);
  if (pcVar5 != (char *)0x0) {
    do {
      if (pcVar5 < __s) {
        __assert_fail("r >= pstr",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                      ,0x4c,"std::vector<int> ASDCP::version_split(const char *)");
      }
      if (__s < pcVar5) {
        lVar6 = strtol(__s,(char **)0x0,10);
        local_6c = (int)lVar6;
        if (local_68.super_string._M_dataplus._M_p ==
            (pointer)local_68.super_string._M_string_length) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_68,
                     (iterator)local_68.super_string._M_dataplus._M_p,&local_6c);
        }
        else {
          *(int *)local_68.super_string._M_dataplus._M_p = local_6c;
          local_68.super_string._M_dataplus._M_p = local_68.super_string._M_dataplus._M_p + 4;
        }
      }
      __s = pcVar5 + 1;
      pcVar5 = strchr(__s,0x2e);
    } while (pcVar5 != (char *)0x0);
  }
  if (*__s != '\0') {
    lVar6 = strtol(__s,(char **)0x0,10);
    local_6c = (int)lVar6;
    if (local_68.super_string._M_dataplus._M_p == (pointer)local_68.super_string._M_string_length) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&local_68,
                 (iterator)local_68.super_string._M_dataplus._M_p,&local_6c);
    }
    else {
      *(int *)local_68.super_string._M_dataplus._M_p = local_6c;
      local_68.super_string._M_dataplus._M_p = local_68.super_string._M_dataplus._M_p + 4;
    }
  }
  if ((long)local_68.super_string._M_dataplus._M_p - (long)local_68.super_IArchive._vptr_IArchive !=
      0xc) {
    __assert_fail("result.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x57,"std::vector<int> ASDCP::version_split(const char *)");
  }
  (this_01->ToolkitVersion).Major = *(ui16_t *)local_68.super_IArchive._vptr_IArchive;
  (this_01->ToolkitVersion).Minor = *(ui16_t *)((long)local_68.super_IArchive._vptr_IArchive + 4);
  (this_01->ToolkitVersion).Patch = *(ui16_t *)(local_68.super_IArchive._vptr_IArchive + 1);
  (this_01->ToolkitVersion).Build = 0x6a68;
  (this_01->ToolkitVersion).Release = RL_RELEASE;
  operator_delete(local_68.super_IArchive._vptr_IArchive,
                  local_68.super_string._M_string_length -
                  (long)local_68.super_IArchive._vptr_IArchive);
  return;
}

Assistant:

void InitHeader(const MXFVersion& mxf_ver, const std::vector<ASDCP::UL>* conformsToSpecifications = NULL)
	{
	  assert(m_Dict);
	  assert(m_EssenceDescriptor);
 
	  m_HeaderPart.m_Primer.ClearTagList();
	  m_HeaderPart.m_Preface = new Preface(m_Dict);
	  m_HeaderPart.AddChildObject(m_HeaderPart.m_Preface);

		// add conformsToSpecifications, if it exists

		if (conformsToSpecifications && conformsToSpecifications->size() > 0) {

			m_HeaderPart.m_Preface->ConformsToSpecifications.set_has_value();

			m_HeaderPart.m_Preface->ConformsToSpecifications.get().insert(
				conformsToSpecifications->begin(),
				conformsToSpecifications->end()
			);
		}

	  // Set the Operational Pattern label -- we're just starting and have no RIP or index,
	  // so we tell the world by using OP1a
	  m_HeaderPart.m_Preface->OperationalPattern = UL(m_Dict->ul(MDD_OP1a));
	  m_HeaderPart.OperationalPattern = m_HeaderPart.m_Preface->OperationalPattern;

	  if ( mxf_ver == MXFVersion_2004 )
	    {
	      m_HeaderPart.MinorVersion = MXF_2004_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2004_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }
	  else
	    {
	      assert(mxf_ver == MXFVersion_2011);
	      m_HeaderPart.MinorVersion = MXF_2011_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2011_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }

	  // Identification
	  Identification* Ident = new Identification(m_Dict);
	  m_HeaderPart.AddChildObject(Ident);
	  m_HeaderPart.m_Preface->Identifications.push_back(Ident->InstanceUID);

	  Kumu::GenRandomValue(Ident->ThisGenerationUID);
	  Ident->CompanyName = m_Info.CompanyName.c_str();
	  Ident->ProductName = m_Info.ProductName.c_str();
	  Ident->VersionString = m_Info.ProductVersion.c_str();
	  Ident->ProductUID.Set(m_Info.ProductUUID);
	  Ident->Platform = ASDCP_PLATFORM;

	  std::vector<int> version = version_split(Version());

	  Ident->ToolkitVersion.Major = version[0];
	  Ident->ToolkitVersion.Minor = version[1];
	  Ident->ToolkitVersion.Patch = version[2];
	  Ident->ToolkitVersion.Build = ASDCP_BUILD_NUMBER;
	  Ident->ToolkitVersion.Release = VersionType::RL_RELEASE;
	}